

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  OpenJTalk *openjtalk;
  OpenJTalk *extraout_RAX;
  FILE *pFVar3;
  
  get_option(argc,argv);
  iVar2 = fileno(_stdin);
  iVar2 = isatty(iVar2);
  openjtalk = (OpenJTalk *)openjtalk_initialize(0,0,0);
  if (openjtalk == (OpenJTalk *)0x0) {
    error_exit("OpenJTalk Initialization faileda.");
    openjtalk = extraout_RAX;
  }
  if (voice[0] != '\0') {
    if (voice[0] == '?') {
      print_voice_list(openjtalk);
      goto LAB_00101ab7;
    }
    cVar1 = openjtalk_setVoice(openjtalk,voice);
    if (cVar1 == '\0') {
      fprintf(_stderr,"Voice \'%s\' not found.\n",voice);
      goto LAB_00101a34;
    }
  }
  if (message[0] == '\0') {
    if (outfile[0] == '\0') {
      if (infile[0] == '\0') {
        pFVar3 = _stdin;
        if (iVar2 != 0) {
          speak_stdin_console(openjtalk);
          goto LAB_00101ab7;
        }
      }
      else {
        pFVar3 = fopen(infile,"r");
        if (pFVar3 == (FILE *)0x0) {
LAB_00101a34:
          openjtalk_clear(openjtalk);
          exit(1);
        }
      }
      speak_file(openjtalk,(FILE *)pFVar3);
    }
    else {
      if (infile[0] == '\0') {
        pFVar3 = _stdin;
        if (iVar2 != 0) {
          speak_stdin_console_to_file(openjtalk);
          goto LAB_00101ab7;
        }
      }
      else {
        pFVar3 = fopen(infile,"r");
        if (pFVar3 == (FILE *)0x0) goto LAB_00101a34;
      }
      speak_file_to_file(openjtalk,(FILE *)pFVar3);
    }
  }
  else if (outfile[0] == '\0') {
    speak_commandline(openjtalk);
  }
  else {
    speak_commandline_to_file(openjtalk);
  }
LAB_00101ab7:
  openjtalk_clear();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
	get_option(argc, argv);

#if defined(_WIN32)
	const bool stdin_console = _isatty(_fileno(stdin));
#else
	const bool stdin_console = isatty(fileno(stdin));
#endif

	OpenJTalk *openjtalk = openjtalk_initialize(NULL,NULL,NULL);
	if (openjtalk == NULL)
	{
		error_exit("OpenJTalk Initialization faileda.");
	}

	if (voice != NULL && strlen(voice)>0)
	{
		if (voice[0] == '?')
		{
			print_voice_list(openjtalk);
			goto exit_success;
		}
#if defined(_WIN32)
		bool res = openjtalk_setVoiceSjis(openjtalk, voice);
#else
		bool res = openjtalk_setVoice(openjtalk, voice);
#endif
		if (!res)
		{
			fprintf(stderr, "Voice '%s' not found.\n", voice);
			openjtalk_clear(openjtalk);
			exit(EXIT_FAILURE);
		}
	}

	if (message != NULL && strlen(message) > 0)
	{
		if (outfile != NULL && strlen(outfile) > 0)
		{
			speak_commandline_to_file(openjtalk);
		}
		else
		{
			speak_commandline(openjtalk);
		}
		goto exit_success;
	}

	if (outfile != NULL && strlen(outfile) > 0)
	{
		if (infile != NULL && strlen(infile) > 0)
		{
			FILE *fp = NULL;
			if ((fp = fopen(infile, "r")) == NULL)
			{
				openjtalk_clear(openjtalk);
				exit(EXIT_FAILURE);
			}
			speak_file_to_file(openjtalk, fp);
		}
		else
		{
			if (stdin_console)
			{
				speak_stdin_console_to_file(openjtalk);
			}
			else
			{
				speak_file_to_file(openjtalk, stdin);
			}
		}
		goto exit_success;
	}

	if (infile != NULL && strlen(infile) > 0)
	{
		FILE *fp = NULL;
		if ((fp = fopen(infile, "r")) == NULL)
		{
			openjtalk_clear(openjtalk);
			exit(EXIT_FAILURE);
		}
		speak_file(openjtalk, fp);
	}
	else
	{
		if (stdin_console)
		{
			speak_stdin_console(openjtalk);
		}
		else
		{
			speak_file(openjtalk, stdin);
		}
	}

exit_success:
	openjtalk_clear(openjtalk);
	exit(EXIT_SUCCESS);
}